

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocationpool.h
# Opt level: O1

RectangleNode * __thiscall
rengine::AllocationPool<rengine::RectangleNode>::allocate
          (AllocationPool<rengine::RectangleNode> *this)

{
  Node **ppNVar1;
  undefined1 *puVar2;
  uint uVar3;
  RectangleNode *pRVar4;
  uint *puVar5;
  
  uVar3 = this->m_nextFree;
  if (this->m_poolSize <= uVar3) {
    __assert_fail("!isExhausted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x3f,
                  "T *rengine::AllocationPool<rengine::RectangleNode>::allocate() [T = rengine::RectangleNode]"
                 );
  }
  pRVar4 = this->m_memory;
  if (pRVar4 == (RectangleNode *)0x0) {
    __assert_fail("m_memory",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x40,
                  "T *rengine::AllocationPool<rengine::RectangleNode>::allocate() [T = rengine::RectangleNode]"
                 );
  }
  puVar5 = this->m_free;
  if (puVar5 == (uint *)0x0) {
    __assert_fail("m_free",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                  ,0x41,
                  "T *rengine::AllocationPool<rengine::RectangleNode>::allocate() [T = rengine::RectangleNode]"
                 );
  }
  if (puVar5[uVar3] < this->m_poolSize) {
    this->m_nextFree = uVar3 + 1;
    uVar3 = puVar5[uVar3];
    pRVar4[uVar3].super_RectangleNodeBase.super_Node.super_SignalEmitter.m_buckets =
         (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
          *)0x0;
    ppNVar1 = &pRVar4[uVar3].super_RectangleNodeBase.super_Node.m_parent;
    *ppNVar1 = (Node *)0x0;
    ppNVar1[1] = (Node *)0x0;
    ppNVar1 = &pRVar4[uVar3].super_RectangleNodeBase.super_Node.m_next;
    *ppNVar1 = (Node *)0x0;
    ppNVar1[1] = (Node *)0x0;
    *(uint *)&pRVar4[uVar3].super_RectangleNodeBase.super_Node.field_0x30 =
         *(uint *)&pRVar4[uVar3].super_RectangleNodeBase.super_Node.field_0x30 & 0xfffff800 | 0x41;
    puVar2 = &pRVar4[uVar3].super_RectangleNodeBase.super_Node.field_0x34;
    *(undefined8 *)puVar2 = 0;
    *(undefined8 *)(puVar2 + 8) = 0;
    pRVar4[uVar3].super_RectangleNodeBase.super_Node.super_SignalEmitter._vptr_SignalEmitter =
         (_func_int **)&PTR__Node_00138bb8;
    puVar2 = &pRVar4[uVar3].super_RectangleNodeBase.field_0x44;
    *(undefined8 *)puVar2 = 0;
    *(undefined8 *)(puVar2 + 8) = 0;
    return pRVar4 + uVar3;
  }
  __assert_fail("m_free[m_nextFree] < m_poolSize",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/common/allocationpool.h"
                ,0x42,
                "T *rengine::AllocationPool<rengine::RectangleNode>::allocate() [T = rengine::RectangleNode]"
               );
}

Assistant:

T *allocate() {
        assert(!isExhausted());
        assert(m_memory);
        assert(m_free);
        assert(m_free[m_nextFree] < m_poolSize);

        // std::cout << "AllocationPool::allocate: memory=" << m_memory
        //           << ", free=" << m_free
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        T *t = m_memory + m_free[m_nextFree++];
        // std::cout << " --> t=" << (void *) t
        //           << ", nextFree=" << m_nextFree
        //           << ", free[nextFree]=" << m_free[m_nextFree] << std::endl;

        return new (t) T();
    }